

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Assign<duckdb::string_t,double,duckdb::ArgMinMaxState<duckdb::string_t,double>>
               (ArgMinMaxState<duckdb::string_t,_double> *state,string_t *x,double *y,bool x_null)

{
  undefined7 in_register_00000009;
  string_t new_value;
  
  new_value.value._8_8_ = CONCAT71(in_register_00000009,x_null);
  (state->super_ArgMinMaxStateBase).arg_null = x_null;
  if ((int)new_value.value._8_8_ == 0) {
    new_value.value._0_8_ = (x->value).pointer.ptr;
    ArgMinMaxStateBase::AssignValue<duckdb::string_t>
              ((ArgMinMaxStateBase *)&state->arg,*(string_t **)&x->value,new_value);
  }
  state->value = *y;
  return;
}

Assistant:

static void Assign(STATE &state, const A_TYPE &x, const B_TYPE &y, const bool x_null) {
		if (IGNORE_NULL) {
			STATE::template AssignValue<A_TYPE>(state.arg, x);
			STATE::template AssignValue<B_TYPE>(state.value, y);
		} else {
			state.arg_null = x_null;
			if (!state.arg_null) {
				STATE::template AssignValue<A_TYPE>(state.arg, x);
			}
			STATE::template AssignValue<B_TYPE>(state.value, y);
		}
	}